

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_data_into_fd.c
# Opt level: O0

int archive_read_data_into_fd(archive *a,int fd)

{
  int iVar1;
  uint can_lseek_00;
  int *piVar2;
  bool local_111;
  void *local_110;
  char *p;
  int magic_test;
  size_t nulls_size;
  char *nulls;
  long lStack_e8;
  int can_lseek;
  int64_t actual_offset;
  int64_t target_offset;
  ssize_t bytes_written;
  size_t bytes_to_write;
  size_t size;
  void *buff;
  int r2;
  int r;
  stat st;
  int fd_local;
  archive *a_local;
  
  lStack_e8 = 0;
  nulls_size = 0;
  st.__glibc_reserved[2]._4_4_ = fd;
  iVar1 = __archive_check_magic(a,0xdeb0c5,4,"archive_read_data_into_fd");
  if (iVar1 == -0x1e) {
    a_local._4_4_ = -0x1e;
  }
  else {
    iVar1 = fstat(st.__glibc_reserved[2]._4_4_,(stat *)&r2);
    local_111 = iVar1 == 0 && ((uint)st.st_nlink & 0xf000) == 0x8000;
    can_lseek_00 = (uint)local_111;
    if ((can_lseek_00 == 0) &&
       (nulls_size = (size_t)calloc(1,0x4000), (void *)nulls_size == (void *)0x0)) {
      buff._4_4_ = -0x1e;
    }
    else {
      while (buff._4_4_ = archive_read_data_block(a,(void **)&size,&bytes_to_write,&actual_offset),
            buff._4_4_ == 0) {
        local_110 = (void *)size;
        if (lStack_e8 < actual_offset) {
          buff._4_4_ = pad_to(a,st.__glibc_reserved[2]._4_4_,can_lseek_00,0x4000,(char *)nulls_size,
                              actual_offset,lStack_e8);
          if (buff._4_4_ != 0) break;
          lStack_e8 = actual_offset;
        }
        buff._4_4_ = 0;
        for (; bytes_to_write != 0; bytes_to_write = bytes_to_write - target_offset) {
          bytes_written = bytes_to_write;
          if (0x100000 < bytes_to_write) {
            bytes_written = 0x100000;
          }
          target_offset = write(st.__glibc_reserved[2]._4_4_,local_110,bytes_written);
          if (target_offset < 0) {
            piVar2 = __errno_location();
            archive_set_error(a,*piVar2,"Write error");
            buff._4_4_ = -0x1e;
            goto LAB_00106018;
          }
          lStack_e8 = target_offset + lStack_e8;
          local_110 = (void *)(target_offset + (long)local_110);
        }
      }
      if (((buff._4_4_ == 1) && (lStack_e8 < actual_offset)) &&
         (buff._0_4_ = pad_to(a,st.__glibc_reserved[2]._4_4_,can_lseek_00,0x4000,(char *)nulls_size,
                              actual_offset,lStack_e8), (int)buff != 0)) {
        buff._4_4_ = (int)buff;
      }
    }
LAB_00106018:
    free((void *)nulls_size);
    if (buff._4_4_ == 1) {
      a_local._4_4_ = 0;
    }
    else {
      a_local._4_4_ = buff._4_4_;
    }
  }
  return a_local._4_4_;
}

Assistant:

int
archive_read_data_into_fd(struct archive *a, int fd)
{
	struct stat st;
	int r, r2;
	const void *buff;
	size_t size, bytes_to_write;
	ssize_t bytes_written;
	int64_t target_offset;
	int64_t actual_offset = 0;
	int can_lseek;
	char *nulls = NULL;
	size_t nulls_size = 16384;

	archive_check_magic(a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_DATA,
	    "archive_read_data_into_fd");

	can_lseek = (fstat(fd, &st) == 0) && S_ISREG(st.st_mode);
	if (!can_lseek) {
		nulls = calloc(1, nulls_size);
		if (!nulls) {
			r = ARCHIVE_FATAL;
			goto cleanup;
		}
	}

	while ((r = archive_read_data_block(a, &buff, &size, &target_offset)) ==
	    ARCHIVE_OK) {
		const char *p = buff;
		if (target_offset > actual_offset) {
			r = pad_to(a, fd, can_lseek, nulls_size, nulls,
			    target_offset, actual_offset);
			if (r != ARCHIVE_OK)
				break;
			actual_offset = target_offset;
		}
		while (size > 0) {
			bytes_to_write = size;
			if (bytes_to_write > MAX_WRITE)
				bytes_to_write = MAX_WRITE;
			bytes_written = write(fd, p, bytes_to_write);
			if (bytes_written < 0) {
				archive_set_error(a, errno, "Write error");
				r = ARCHIVE_FATAL;
				goto cleanup;
			}
			actual_offset += bytes_written;
			p += bytes_written;
			size -= bytes_written;
		}
	}

	if (r == ARCHIVE_EOF && target_offset > actual_offset) {
		r2 = pad_to(a, fd, can_lseek, nulls_size, nulls,
		    target_offset, actual_offset);
		if (r2 != ARCHIVE_OK)
			r = r2;
	}

cleanup:
	free(nulls);
	if (r != ARCHIVE_EOF)
		return (r);
	return (ARCHIVE_OK);
}